

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modifiers.hpp
# Opt level: O2

void __thiscall
pstore::command_line::details::values::
apply<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>>
          (values *this,opt<endian,_pstore::command_line::parser<endian,_void>_> *o)

{
  literal *v;
  literal *name;
  long lVar1;
  
  name = (this->values_).buffer_;
  for (lVar1 = (this->values_).elements_ * 0x48; lVar1 != 0; lVar1 = lVar1 + -0x48) {
    parser_base::add_literal_option
              (&(o->parser_).super_parser_base,&name->name,name->value,&name->description);
    name = name + 1;
  }
  return;
}

Assistant:

void apply (Opt & o) const {
                    if (parser_base * const p = o.get_parser ()) {
                        for (auto const & v : values_) {
                            p->add_literal_option (v.name, v.value, v.description);
                        }
                    }
                }